

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSweep.c
# Opt level: O2

void Cec_ManFraCreateInfo(Cec_ManSim_t *p,Vec_Ptr_t *vCiInfo,Vec_Ptr_t *vInfo,int nSeries)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < p->pAig->vCis->nSize; i_00 = i_00 + 1) {
    pvVar1 = Vec_PtrEntry(vCiInfo,i_00);
    pvVar2 = Vec_PtrEntry(vInfo,i_00);
    iVar5 = p->nWords;
    iVar3 = iVar5 * nSeries;
    for (lVar4 = 0; lVar4 < iVar5; lVar4 = lVar4 + 1) {
      *(undefined4 *)((long)pvVar1 + lVar4 * 4) =
           *(undefined4 *)((long)pvVar2 + lVar4 * 4 + (long)iVar3 * 4);
      iVar5 = p->nWords;
    }
  }
  return;
}

Assistant:

void Cec_ManFraCreateInfo( Cec_ManSim_t * p, Vec_Ptr_t * vCiInfo, Vec_Ptr_t * vInfo, int nSeries )
{
    unsigned * pRes0, * pRes1;
    int i, w;
    for ( i = 0; i < Gia_ManCiNum(p->pAig); i++ )
    {
        pRes0 = (unsigned *)Vec_PtrEntry( vCiInfo, i );
        pRes1 = (unsigned *)Vec_PtrEntry( vInfo, i );
        pRes1 += p->nWords * nSeries;
        for ( w = 0; w < p->nWords; w++ )
            pRes0[w] = pRes1[w];
    }
}